

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

bool __thiscall rw::Texture::streamWrite(Texture *this,Stream *stream)

{
  uint32 size;
  size_t sVar1;
  uint uVar2;
  char acStack_58 [32];
  undefined4 local_38;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,6,size);
  writeChunkHeader(stream,1,4);
  uVar2 = this->filterAddressing;
  if (this->raster != (Raster *)0x0) {
    uVar2 = uVar2 | (~this->raster->format & 0x1000U) << 4;
  }
  Stream::writeU32(stream,uVar2);
  local_38 = 0;
  strncpy(acStack_58,this->name,0x20);
  sVar1 = strlen(acStack_58);
  uVar2 = ((uint)sVar1 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar2);
  (*stream->_vptr_Stream[3])(stream,acStack_58,(ulong)uVar2);
  local_38 = 0;
  strncpy(acStack_58,this->mask,0x20);
  sVar1 = strlen(acStack_58);
  uVar2 = ((uint)sVar1 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar2);
  (*stream->_vptr_Stream[3])(stream,acStack_58,(ulong)uVar2);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Texture::streamWrite(Stream *stream)
{
	int size;
	char buf[36];
	writeChunkHeader(stream, ID_TEXTURE, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	uint32 filterAddressing = this->filterAddressing;
	if(this->raster && (raster->format & Raster::AUTOMIPMAP) == 0)
		filterAddressing |= 0x10000;
	stream->writeU32(filterAddressing);

	memset(buf, 0, 36);
	strncpy(buf, this->name, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	memset(buf, 0, 36);
	strncpy(buf, this->mask, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	s_plglist.streamWrite(stream, this);
	return true;
}